

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_inflate(uchar **out,size_t *outsize,uchar *in,size_t insize,
                    LodePNGDecompressSettings *settings)

{
  ushort uVar1;
  undefined4 uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uchar *puVar7;
  HuffmanTree *pHVar8;
  HuffmanTree *pHVar9;
  uchar *puVar10;
  HuffmanTree *pHVar11;
  byte bVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  undefined4 *puVar16;
  uint uVar17;
  undefined4 *puVar18;
  HuffmanTree *pHVar19;
  int iVar20;
  HuffmanTree *pHVar21;
  long lVar22;
  ulong uVar23;
  char cVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  HuffmanTree *pHVar29;
  bool bVar30;
  HuffmanTree tree_ll;
  LodePNGBitReader local_140;
  HuffmanTree *local_118;
  uint local_10c;
  undefined8 local_108;
  uchar *local_100;
  HuffmanTree *local_f8;
  HuffmanTree *local_f0;
  HuffmanTree *local_e8;
  uint local_dc;
  ulong local_d8;
  ulong local_d0;
  HuffmanTree local_c8;
  LodePNGDecompressSettings *local_a0;
  uchar **local_98;
  ulong *local_90;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  local_100 = *out;
  pHVar8 = (HuffmanTree *)*outsize;
  local_140.bitsize = insize * 8;
  uVar4 = 0x69;
  local_e8 = pHVar8;
  local_98 = out;
  local_90 = outsize;
  if (local_140.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_140.bp = 0;
    local_140.buffer = 0;
    local_10c = 0;
    pHVar21 = (HuffmanTree *)0x0;
    uVar17 = 0;
    uVar5 = 0;
    local_140.data = in;
    local_140.size = insize;
    local_a0 = settings;
    do {
      uVar4 = uVar5;
      if (uVar17 != 0) break;
      uVar4 = ensureBits9(&local_140,(size_t)outsize);
      puVar10 = local_100;
      sVar3 = local_140.size;
      if (uVar4 == 0) {
        bVar30 = false;
        local_10c = 0x34;
      }
      else {
        local_dc = local_140.buffer & 1;
        uVar4 = local_140.buffer >> 1 & 3;
        local_140.buffer = local_140.buffer >> 3;
        uVar26 = local_140.bp + 3;
        if (uVar4 == 3) {
          bVar30 = false;
          local_10c = 0x14;
          uVar17 = local_dc;
          local_140.bp = uVar26;
        }
        else {
          if (uVar4 == 0) {
            uVar25 = local_140.bp + 10 >> 3;
            pHVar29 = (HuffmanTree *)(uVar25 + 4);
            uVar5 = 0x34;
            local_140.bp = uVar26;
            local_118 = pHVar21;
            if (pHVar29 < local_140.size) {
              uVar1 = *(ushort *)(local_140.data + uVar25);
              outsize = (size_t *)(ulong)uVar1;
              if ((local_a0->ignore_nlen != 0) ||
                 (uVar5 = 0x15,
                 (uint)*(ushort *)(local_140.data + uVar25 + 2) + (uint)uVar1 == 0xffff)) {
                pHVar11 = (HuffmanTree *)
                          ((long)&((HuffmanTree *)outsize)->codes + (long)&pHVar21->codes);
                if (pHVar8 < pHVar11) {
                  pHVar19 = (HuffmanTree *)((ulong)((long)pHVar11 * 3) >> 1);
                  if ((HuffmanTree *)((long)pHVar8 * 2) < pHVar11) {
                    pHVar19 = pHVar11;
                  }
                  local_108 = pHVar8;
                  local_f8 = (HuffmanTree *)outsize;
                  puVar7 = (uchar *)realloc(local_100,(size_t)pHVar19);
                  bVar30 = puVar7 == (uchar *)0x0;
                  pHVar9 = local_f8;
                  pHVar8 = local_108;
                  if (!bVar30) {
                    pHVar8 = pHVar19;
                    puVar10 = puVar7;
                    local_e8 = pHVar11;
                  }
                }
                else {
                  bVar30 = false;
                  pHVar9 = (HuffmanTree *)outsize;
                  local_e8 = pHVar11;
                }
                uVar5 = 0x53;
                pHVar21 = local_118;
                local_100 = puVar10;
                if (!bVar30) {
                  pHVar19 = (HuffmanTree *)((long)&pHVar9->codes + (long)&pHVar29->codes);
                  local_108 = pHVar8;
                  if (sVar3 < pHVar19) {
                    uVar5 = 0x17;
                  }
                  else {
                    if (uVar1 != 0) {
                      outsize = (size_t *)(local_140.data + (long)&pHVar29->codes);
                      memcpy(puVar10 + (long)&local_118->codes,outsize,(size_t)pHVar9);
                    }
                    uVar5 = 0;
                    pHVar8 = local_108;
                    pHVar21 = pHVar11;
                    local_140.bp = (long)pHVar19 * 8;
                  }
                }
              }
            }
          }
          else {
            local_c8.codes = (uint *)0x0;
            local_c8.lengths = (uint *)0x0;
            local_c8.table_len = (uchar *)0x0;
            local_c8.table_value = (unsigned_short *)0x0;
            local_88.codes = (uint *)0x0;
            local_88.lengths = (uint *)0x0;
            local_88.table_len = (uchar *)0x0;
            local_88.table_value = (unsigned_short *)0x0;
            if (uVar4 == 1) {
              local_140.bp = uVar26;
              generateFixedLitLenTree(&local_c8);
              generateFixedDistanceTree(&local_88);
              uVar5 = 0;
              uVar26 = local_140.bp;
            }
            else {
              pHVar29 = (HuffmanTree *)(uVar26 >> 3);
              outsize = (size_t *)((long)&pHVar29->codes + 2);
              if (outsize < local_140.size) {
                outsize = (size_t *)(ulong)*(ushort *)(local_140.data + (long)pHVar29);
                local_140.buffer =
                     (uint)(uint3)(CONCAT12((local_140.data + 2)[(long)pHVar29],
                                            *(ushort *)(local_140.data + (long)pHVar29)) >>
                                  ((byte)uVar26 & 7));
              }
              else {
                local_140.buffer = 0;
                if (pHVar29 < local_140.size) {
                  outsize = (size_t *)(ulong)local_140.data[(long)pHVar29];
                  local_140.buffer = (uint)local_140.data[(long)pHVar29];
                }
                pHVar29 = (HuffmanTree *)((long)&pHVar29->codes + 1);
                if (pHVar29 < local_140.size) {
                  local_140.buffer = local_140.buffer | (uint)local_140.data[(long)pHVar29] << 8;
                }
                local_140.buffer = local_140.buffer >> ((byte)uVar26 & 7);
                uVar5 = 0x31;
                if (local_140.bitsize <= local_140.bp + 0x11) goto LAB_0010e288;
              }
              uVar4 = local_140.buffer;
              local_140.buffer = local_140.buffer >> 0xe;
              uVar26 = local_140.bp + 0x11;
              local_140.bp = uVar26;
              local_118 = pHVar21;
              local_108 = pHVar8;
              pHVar8 = (HuffmanTree *)malloc(0x4c);
              if (pHVar8 == (HuffmanTree *)0x0) {
                uVar5 = 0x53;
                pHVar8 = local_108;
                pHVar21 = local_118;
                uVar26 = local_140.bp;
              }
              else {
                uVar23 = (ulong)(uVar4 >> 10 & 0xf);
                local_58.codes = (uint *)0x0;
                local_58.lengths = (uint *)0x0;
                local_58.table_len = (uchar *)0x0;
                local_58.table_value = (unsigned_short *)0x0;
                uVar25 = (long)(uVar23 + 4) * 3 + uVar26;
                uVar5 = 0x32;
                if (uVar25 < uVar26) {
LAB_0010e233:
                  pHVar21 = (HuffmanTree *)0x0;
                  pHVar29 = (HuffmanTree *)0x0;
                }
                else {
                  pHVar21 = (HuffmanTree *)0x0;
                  pHVar29 = (HuffmanTree *)0x0;
                  if (uVar25 <= local_140.bitsize) {
                    local_d8 = (ulong)(uVar4 & 0x1f);
                    local_f8 = (HuffmanTree *)(local_d8 + 0x101);
                    local_d0 = (ulong)((uVar4 >> 5 & 0x1f) + 1);
                    lVar22 = 0;
                    local_f0 = (HuffmanTree *)(uVar23 + 4);
                    do {
                      ensureBits9(&local_140,(size_t)outsize);
                      uVar4 = local_140.buffer & 7;
                      local_140.buffer = local_140.buffer >> 3;
                      local_140.bp = local_140.bp + 3;
                      *(uint *)((long)&pHVar8->codes +
                               (ulong)*(uint *)((long)CLCL_ORDER + lVar22) * 4) = uVar4;
                      lVar22 = lVar22 + 4;
                    } while (uVar23 * 4 + 0x10 != lVar22);
                    if ((int)local_f0 != 0x13) {
                      do {
                        *(undefined4 *)((long)&pHVar8->codes + (ulong)CLCL_ORDER[uVar23 + 4] * 4) =
                             0;
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != 0xf);
                    }
                    outsize = (size_t *)pHVar8;
                    uVar5 = HuffmanTree_makeFromLengths(&local_58,(uint *)pHVar8,0x13,7);
                    uVar26 = local_d0;
                    if (uVar5 != 0) goto LAB_0010e233;
                    pHVar21 = (HuffmanTree *)malloc(0x480);
                    pHVar29 = (HuffmanTree *)malloc(0x80);
                    uVar5 = 0x53;
                    if (pHVar29 != (HuffmanTree *)0x0 && pHVar21 != (HuffmanTree *)0x0) {
                      uVar5 = 0;
                      outsize = (size_t *)0x0;
                      local_f0 = pHVar21;
                      memset(pHVar21,0,0x480);
                      pHVar29->codes = (uint *)0x0;
                      pHVar29->lengths = (uint *)0x0;
                      pHVar29->maxbitlen = 0;
                      pHVar29->numcodes = 0;
                      pHVar29->table_len = (uchar *)0x0;
                      pHVar29->table_value = (unsigned_short *)0x0;
                      pHVar29[1].codes = (uint *)0x0;
                      pHVar29[1].lengths = (uint *)0x0;
                      pHVar29[1].maxbitlen = 0;
                      pHVar29[1].numcodes = 0;
                      pHVar29[1].table_len = (uchar *)0x0;
                      pHVar29[1].table_value = (unsigned_short *)0x0;
                      pHVar29[2].codes = (uint *)0x0;
                      pHVar29[2].lengths = (uint *)0x0;
                      pHVar29[2].maxbitlen = 0;
                      pHVar29[2].numcodes = 0;
                      pHVar29[2].table_len = (uchar *)0x0;
                      pHVar29[2].table_value = (unsigned_short *)0x0;
                      pHVar29[3].codes = (uint *)0x0;
                      uVar17 = (int)uVar26 + (int)local_f8;
                      pHVar11 = (HuffmanTree *)(ulong)uVar17;
                      local_d0 = CONCAT44(local_d0._4_4_,(int)local_d8 + 0x102);
                      uVar4 = -(int)local_d8;
                      local_d8 = (ulong)uVar4;
                      iVar20 = uVar4 - 0x101;
                      pHVar21 = (HuffmanTree *)0x0;
                      do {
                        uVar4 = (uint)pHVar21;
                        if (uVar17 <= uVar4) break;
                        pHVar9 = (HuffmanTree *)(local_140.bp >> 3);
                        if ((HuffmanTree *)((long)&pHVar9->codes + 3U) < local_140.size) {
                          local_140.buffer = *(uint *)(local_140.data + (long)pHVar9);
                        }
                        else {
                          local_140.buffer = 0;
                          if (pHVar9 < local_140.size) {
                            local_140.buffer = (uint)local_140.data[(long)pHVar9];
                          }
                          pHVar19 = (HuffmanTree *)((long)&pHVar9->codes + 1);
                          if (pHVar19 < local_140.size) {
                            local_140.buffer =
                                 local_140.buffer | (uint)local_140.data[(long)pHVar19] << 8;
                          }
                          pHVar9 = (HuffmanTree *)((long)&pHVar9->codes + 2);
                          if (pHVar9 < local_140.size) {
                            local_140.buffer =
                                 local_140.buffer | (uint)local_140.data[(long)pHVar9] << 0x10;
                          }
                        }
                        local_140.buffer = local_140.buffer >> ((byte)local_140.bp & 7);
                        outsize = (size_t *)&local_58;
                        uVar6 = huffmanDecodeSymbol(&local_140,(HuffmanTree *)outsize);
                        if (uVar6 < 0x10) {
                          uVar13 = (uint)local_f8;
                          pHVar21 = pHVar29;
                          if (uVar4 < uVar13) {
                            uVar13 = 0;
                            pHVar21 = local_f0;
                          }
                          outsize = (size_t *)(ulong)(uVar4 - uVar13);
                          *(uint *)((long)&pHVar21->codes + (long)outsize * 4) = uVar6;
                          pHVar21 = (HuffmanTree *)(ulong)(uVar4 + 1);
LAB_0010e8c1:
                          if (local_140.bitsize < local_140.bp) {
                            uVar5 = 0x32;
                          }
                          iVar14 = 0;
                          if (local_140.bitsize < local_140.bp) {
                            iVar14 = 0x11;
                          }
                        }
                        else {
                          if (uVar6 == 0x12) {
                            uVar4 = local_140.buffer >> 7;
                            local_140.bp = local_140.bp + 7;
                            pHVar21 = (HuffmanTree *)((ulong)pHVar21 & 0xffffffff);
                            puVar16 = (undefined4 *)((long)&local_f0->codes + (long)pHVar21 * 4);
                            iVar14 = (local_140.buffer & 0x7f) + 0xb;
                            do {
                              local_140.buffer = uVar4;
                              if (pHVar11 <= pHVar21) {
                                uVar5 = 0xf;
                                break;
                              }
                              puVar18 = (undefined4 *)
                                        ((long)&pHVar29->codes +
                                        (ulong)(uint)(iVar20 + (int)pHVar21) * 4);
                              if (pHVar21 < local_f8) {
                                puVar18 = puVar16;
                              }
                              *puVar18 = 0;
                              pHVar21 = (HuffmanTree *)((long)&pHVar21->codes + 1);
                              puVar16 = puVar16 + 1;
                              iVar14 = iVar14 + -1;
                            } while (iVar14 != 0);
                            goto LAB_0010e8c1;
                          }
                          if (uVar6 == 0x11) {
                            uVar4 = local_140.buffer >> 3;
                            local_140.bp = local_140.bp + 3;
                            pHVar21 = (HuffmanTree *)((ulong)pHVar21 & 0xffffffff);
                            puVar16 = (undefined4 *)((long)&local_f0->codes + (long)pHVar21 * 4);
                            iVar14 = (local_140.buffer & 7) + 3;
                            do {
                              local_140.buffer = uVar4;
                              if (pHVar11 <= pHVar21) {
                                uVar5 = 0xe;
                                break;
                              }
                              puVar18 = (undefined4 *)
                                        ((long)&pHVar29->codes +
                                        (ulong)(uint)(iVar20 + (int)pHVar21) * 4);
                              if (pHVar21 < local_f8) {
                                puVar18 = puVar16;
                              }
                              *puVar18 = 0;
                              pHVar21 = (HuffmanTree *)((long)&pHVar21->codes + 1);
                              puVar16 = puVar16 + 1;
                              iVar14 = iVar14 + -1;
                            } while (iVar14 != 0);
                            goto LAB_0010e8c1;
                          }
                          if (uVar6 == 0x10) {
                            if (uVar4 == 0) {
                              iVar14 = 0x11;
                              uVar6 = 0;
                              uVar5 = 0x36;
                            }
                            else {
                              local_140.bp = local_140.bp + 2;
                              puVar16 = (undefined4 *)
                                        ((long)&pHVar29->codes +
                                        (ulong)((uVar4 - 0x102) + (int)local_d8) * 4);
                              if (uVar4 < (uint)local_d0) {
                                puVar16 = (undefined4 *)
                                          ((long)&local_f0->codes + (ulong)(uVar4 - 1) * 4);
                              }
                              uVar2 = *puVar16;
                              pHVar21 = (HuffmanTree *)((ulong)pHVar21 & 0xffffffff);
                              outsize = (size_t *)((long)&local_f0->codes + (long)pHVar21 * 4);
                              iVar14 = (local_140.buffer & 3) + 3;
                              do {
                                if (pHVar11 <= pHVar21) {
                                  uVar5 = 0xd;
                                  break;
                                }
                                pHVar9 = (HuffmanTree *)
                                         ((long)&pHVar29->codes +
                                         (ulong)(uint)(iVar20 + (int)pHVar21) * 4);
                                if (pHVar21 < local_f8) {
                                  pHVar9 = (HuffmanTree *)outsize;
                                }
                                *(undefined4 *)&pHVar9->codes = uVar2;
                                pHVar21 = (HuffmanTree *)((long)&pHVar21->codes + 1);
                                outsize = (size_t *)((long)&((HuffmanTree *)outsize)->codes + 4);
                                iVar14 = iVar14 + -1;
                              } while (iVar14 != 0);
                              uVar6 = (uint)pHVar21;
                              iVar14 = 0;
                              local_140.buffer = local_140.buffer >> 2;
                            }
                            pHVar21 = (HuffmanTree *)(ulong)uVar6;
                            if (uVar4 != 0) goto LAB_0010e8c1;
                          }
                          else {
                            iVar14 = 0x11;
                            uVar5 = 0x10;
                          }
                        }
                      } while (iVar14 == 0);
                      pHVar21 = local_f0;
                      if (uVar5 == 0) {
                        if (*(int *)&local_f0[0x19].table_len == 0) {
                          uVar5 = 0x40;
                        }
                        else {
                          outsize = (size_t *)local_f0;
                          uVar5 = HuffmanTree_makeFromLengths(&local_c8,(uint *)local_f0,0x120,0xf);
                          if (uVar5 == 0) {
                            outsize = (size_t *)pHVar29;
                            uVar5 = HuffmanTree_makeFromLengths(&local_88,(uint *)pHVar29,0x20,0xf);
                          }
                        }
                      }
                    }
                  }
                }
                free(pHVar8);
                free(pHVar21);
                free(pHVar29);
                HuffmanTree_cleanup(&local_58);
                pHVar8 = local_108;
                pHVar21 = local_118;
                uVar26 = local_140.bp;
              }
            }
LAB_0010e288:
            do {
              local_140.bp = uVar26;
              pHVar11 = &local_c8;
              pHVar29 = pHVar21;
              if (uVar5 != 0) break;
              pHVar9 = (HuffmanTree *)(local_140.bp >> 3);
              if ((HuffmanTree *)((long)&pHVar9->codes + 3U) < local_140.size) {
                local_140.buffer = *(uint *)(local_140.data + (long)pHVar9);
              }
              else {
                local_140.buffer = 0;
                if (pHVar9 < local_140.size) {
                  local_140.buffer = (uint)local_140.data[(long)pHVar9];
                }
                pHVar19 = (HuffmanTree *)((long)&pHVar9->codes + 1);
                if (pHVar19 < local_140.size) {
                  local_140.buffer = local_140.buffer | (uint)local_140.data[(long)pHVar19] << 8;
                }
                pHVar9 = (HuffmanTree *)((long)&pHVar9->codes + 2);
                if (pHVar9 < local_140.size) {
                  local_140.buffer = local_140.buffer | (uint)local_140.data[(long)pHVar9] << 0x10;
                }
              }
              local_140.buffer = local_140.buffer >> ((byte)local_140.bp & 7);
              uVar4 = huffmanDecodeSymbol(&local_140,pHVar11);
              if (uVar4 < 0x100) {
                pHVar29 = (HuffmanTree *)((long)&pHVar21->codes + 1);
                if (pHVar8 < pHVar29) {
                  pHVar9 = (HuffmanTree *)((ulong)((long)pHVar29 * 3) >> 1);
                  if ((HuffmanTree *)((long)pHVar8 * 2) < pHVar29) {
                    pHVar9 = pHVar29;
                  }
                  pHVar11 = pHVar9;
                  puVar10 = (uchar *)realloc(local_100,(size_t)pHVar9);
                  bVar30 = puVar10 == (uchar *)0x0;
                  if (!bVar30) {
                    pHVar8 = pHVar9;
                    local_100 = puVar10;
                    local_e8 = pHVar29;
                  }
                }
                else {
                  bVar30 = false;
                  local_e8 = pHVar29;
                }
                if (bVar30) {
                  uVar5 = 0x53;
LAB_0010e566:
                  cVar24 = '\x03';
                  pHVar29 = pHVar21;
                }
                else {
                  local_100[(long)pHVar21] = (uchar)uVar4;
LAB_0010e57a:
                  cVar24 = (local_140.bitsize < local_140.bp) * '\x03';
                  if (local_140.bitsize < local_140.bp) {
                    uVar5 = 0x33;
                  }
                }
              }
              else {
                if (0x11d < uVar4 || uVar4 == 0x100) {
                  if (uVar4 != 0x100) {
                    uVar5 = 0x10;
                  }
                  goto LAB_0010e566;
                }
                uVar26 = (ulong)(uVar4 - 0x101);
                pHVar9 = (HuffmanTree *)(ulong)LENGTHBASE[uVar26];
                if (0xffffffffffffffeb < uVar26 - 0x1c) {
                  local_140.bp = local_140.bp + LENGTHEXTRA[uVar26];
                  pHVar9 = (HuffmanTree *)
                           ((long)&pHVar9->codes +
                           (ulong)(~(-1 << ((byte)LENGTHEXTRA[uVar26] & 0x1f)) & local_140.buffer));
                }
                pHVar11 = (HuffmanTree *)(local_140.bp >> 3);
                if ((HuffmanTree *)((long)&pHVar11->codes + 4U) < local_140.size) {
                  bVar12 = (byte)local_140.bp & 7;
                  local_140.buffer =
                       ((uint)(local_140.data + 4)[(long)pHVar11] << 0x18) << (bVar12 ^ 7) |
                       *(uint *)(local_140.data + (long)pHVar11) >> bVar12;
                }
                else {
                  local_140.buffer = 0;
                  if (pHVar11 < local_140.size) {
                    local_140.buffer = (uint)local_140.data[(long)pHVar11];
                  }
                  pHVar19 = (HuffmanTree *)((long)&pHVar11->codes + 1);
                  if (pHVar19 < local_140.size) {
                    local_140.buffer = local_140.buffer | (uint)local_140.data[(long)pHVar19] << 8;
                  }
                  pHVar19 = (HuffmanTree *)((long)&pHVar11->codes + 2);
                  if (pHVar19 < local_140.size) {
                    local_140.buffer =
                         local_140.buffer | (uint)local_140.data[(long)pHVar19] << 0x10;
                  }
                  pHVar11 = (HuffmanTree *)((long)&pHVar11->codes + 3);
                  if (pHVar11 < local_140.size) {
                    local_140.buffer =
                         local_140.buffer | (uint)local_140.data[(long)pHVar11] << 0x18;
                  }
                  local_140.buffer = local_140.buffer >> ((byte)local_140.bp & 7);
                }
                pHVar11 = &local_88;
                uVar5 = huffmanDecodeSymbol(&local_140,pHVar11);
                uVar4 = local_108._4_4_;
                if (uVar5 < 0x1e) {
                  uVar17 = DISTANCEBASE[uVar5];
                  local_108 = (HuffmanTree *)((ulong)local_108._4_4_ << 0x20);
                  if (3 < uVar5) {
                    bVar12 = (byte)DISTANCEEXTRA[uVar5];
                    uVar6 = ~(-1 << (bVar12 & 0x1f)) & local_140.buffer;
                    local_140.buffer = local_140.buffer >> (bVar12 & 0x1f);
                    pHVar11 = (HuffmanTree *)(ulong)local_140.buffer;
                    local_140.bp = local_140.bp + DISTANCEEXTRA[uVar5];
                    uVar17 = uVar17 + uVar6;
                  }
                  pHVar19 = (HuffmanTree *)(ulong)uVar17;
                  cVar24 = '\x03';
                  lVar22 = (long)pHVar21 - (long)pHVar19;
                  local_f8 = pHVar9;
                  if (pHVar21 < pHVar19) {
                    local_108._0_4_ = 0x34;
                    goto LAB_0010e532;
                  }
                  pHVar29 = (HuffmanTree *)((long)&pHVar9->codes + (long)&pHVar21->codes);
                  local_118 = pHVar21;
                  if (pHVar8 < pHVar29) {
                    pHVar21 = (HuffmanTree *)((ulong)((long)pHVar29 * 3) >> 1);
                    if ((HuffmanTree *)((long)pHVar8 * 2) < pHVar29) {
                      pHVar21 = pHVar29;
                    }
                    pHVar11 = pHVar21;
                    puVar10 = (uchar *)realloc(local_100,(size_t)pHVar21);
                    if (puVar10 == (uchar *)0x0) {
                      bVar30 = true;
                    }
                    else {
                      bVar30 = false;
                      pHVar8 = pHVar21;
                      local_100 = puVar10;
                      local_e8 = pHVar29;
                    }
                  }
                  else {
                    bVar30 = false;
                    local_e8 = pHVar29;
                  }
                  puVar10 = local_100;
                  pHVar21 = local_118;
                  if (bVar30) {
                    local_108 = (HuffmanTree *)CONCAT44(local_108._4_4_,0x53);
                    bVar30 = false;
                    pHVar29 = local_118;
                  }
                  else {
                    lVar27 = (long)local_f8 - (long)pHVar19;
                    if (pHVar19 < local_f8) {
                      if (pHVar19 != (HuffmanTree *)0x0) {
                        pHVar11 = (HuffmanTree *)(local_100 + lVar22);
                        memcpy(local_100 + (long)local_118,pHVar11,(size_t)pHVar19);
                      }
                      lVar28 = (long)&pHVar19->codes + (long)&pHVar21->codes;
                      lVar15 = 0;
                      do {
                        puVar10[lVar15 + lVar28] = puVar10[lVar15 + lVar22];
                        lVar15 = lVar15 + 1;
                      } while (lVar27 != lVar15);
                      pHVar29 = (HuffmanTree *)(lVar28 + lVar15);
                      cVar24 = '\0';
                      bVar30 = true;
                    }
                    else {
                      cVar24 = '\0';
                      bVar30 = true;
                      if (local_f8 != (HuffmanTree *)0x0) {
                        pHVar11 = (HuffmanTree *)(local_100 + lVar22);
                        memcpy(local_100 + (long)&local_118->codes,pHVar11,(size_t)local_f8);
                      }
                    }
                  }
                }
                else {
                  local_108._0_4_ = (uint)(uVar5 < 0x20) * 2 + 0x10;
LAB_0010e532:
                  local_108 = (HuffmanTree *)CONCAT44(uVar4,(uint)local_108);
                  cVar24 = '\x03';
                  bVar30 = false;
                }
                uVar5 = (uint)local_108;
                if (bVar30) goto LAB_0010e57a;
              }
              outsize = (size_t *)pHVar11;
              pHVar21 = pHVar29;
              uVar26 = local_140.bp;
            } while (cVar24 == '\0');
            HuffmanTree_cleanup(&local_c8);
            HuffmanTree_cleanup(&local_88);
            pHVar21 = pHVar29;
          }
          bVar30 = uVar5 == 0;
          uVar17 = local_dc;
          if (!bVar30) {
            local_10c = uVar5;
          }
        }
      }
      uVar4 = local_10c;
    } while (bVar30);
  }
  *local_98 = local_100;
  *local_90 = (ulong)local_e8;
  return uVar4;
}

Assistant:

unsigned lodepng_inflate(unsigned char** out, size_t* outsize,
                         const unsigned char* in, size_t insize,
                         const LodePNGDecompressSettings* settings) {
  unsigned error;
  ucvector v;
  ucvector_init_buffer(&v, *out, *outsize);
  error = lodepng_inflatev(&v, in, insize, settings);
  *out = v.data;
  *outsize = v.size;
  return error;
}